

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dag.cpp
# Opt level: O1

bool __thiscall DAGPropagator::propagateNewEdge(DAGPropagator *this,int e)

{
  pointer pTVar1;
  ulong *puVar2;
  int iVar3;
  int *piVar4;
  pointer pTVar5;
  pointer pvVar6;
  uint *puVar7;
  bool bVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  uint *puVar12;
  ulong uVar13;
  
  bVar8 = DReachabilityPropagator::propagateNewEdge(&this->super_DReachabilityPropagator,e);
  if ((!bVar8) ||
     (iVar9 = (*(this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator.
                _vptr_Propagator[0x18])(this,e), (char)iVar9 == '\0')) {
    return false;
  }
  uVar13 = (ulong)e;
  piVar4 = (this->super_DReachabilityPropagator).super_GraphPropagator.endnodes.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar13].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  iVar9 = *piVar4;
  pTVar1 = (this->succs).
           super__Vector_base<DAGPropagator::TrailedSuccList,_std::allocator<DAGPropagator::TrailedSuccList>_>
           ._M_impl.super__Vector_impl_data._M_start + iVar9;
  iVar3 = (pTVar1->super_TrailedConstantAccessList<std::pair<int,_int>,_Tint>).size.v;
  connectTo(this,iVar9,piVar4[1]);
  uVar10 = uVar13 + 0x3f;
  if (-1 < (long)uVar13) {
    uVar10 = uVar13;
  }
  puVar2 = (this->processed_e).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
           ((long)uVar10 >> 6) +
           (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar2 = *puVar2 | 1L << ((byte)e & 0x3f);
  pTVar5 = (this->succs).
           super__Vector_base<DAGPropagator::TrailedSuccList,_std::allocator<DAGPropagator::TrailedSuccList>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar9 = *(this->super_DReachabilityPropagator).super_GraphPropagator.endnodes.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar13].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if ((pTVar1 == pTVar5 + iVar9) &&
     (iVar3 == pTVar5[iVar9].super_TrailedConstantAccessList<std::pair<int,_int>,_Tint>.size.v)) {
    return true;
  }
  lVar11 = (long)iVar3;
  do {
    iVar9 = *(int *)(*(long *)&(pTVar1->super_TrailedConstantAccessList<std::pair<int,_int>,_Tint>).
                               dense.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data + lVar11 * 8);
    pvVar6 = (this->super_DReachabilityPropagator).ou.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar7 = (uint *)pvVar6[iVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    for (puVar12 = *(uint **)&pvVar6[iVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data; puVar12 != puVar7; puVar12 = puVar12 + 1) {
      (*(this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator.
        _vptr_Propagator[0x19])(this,(ulong)*puVar12);
    }
    lVar11 = lVar11 + 1;
    pTVar5 = (this->succs).
             super__Vector_base<DAGPropagator::TrailedSuccList,_std::allocator<DAGPropagator::TrailedSuccList>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar9 = *(this->super_DReachabilityPropagator).super_GraphPropagator.endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar13].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  } while ((pTVar1 != pTVar5 + iVar9) ||
          (pTVar5[iVar9].super_TrailedConstantAccessList<std::pair<int,_int>,_Tint>.size.v !=
           (int)lVar11));
  return true;
}

Assistant:

bool DAGPropagator::propagateNewEdge(int e) {
	if (!DReachabilityPropagator::propagateNewEdge(e)) {
		return false;
	}

	if (!check_cycle(e)) {
		return false;
	}

	TrailedSuccList::const_iterator succ_taile = succs[getTail(e)].end();
	connectTo(getTail(e), getHead(e));
	processed_e[e] = true;

	// Only checking the new ones
	for (; succ_taile != succs[getTail(e)].end(); succ_taile++) {
		const int n = (*succ_taile).first;
		for (const int i : ou[n]) {
			prevent_cycle(i);
		}
	}
	/*
	//Check all reachable
	for (int n = 0; n < nbNodes(); n++) {
			if (reachable(n,getTail(e))) {
					for (int i = 0; i < in[n].size(); i++) {
							assert(!prevent_cycle(in[n][i])); //Assert because already checked before
					}
			}
	}
	*/

	/*    cout <<"Start "<<e<<endl;
	for (int i = 0; i < nbNodes(); i++) {
			for (int j = 0; j < nbNodes(); j++) {
					cout << reachability[i][j]<<",";
			}
			cout <<endl;
			}*/

	return true;
}